

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void parse_ymd_args(int argofs,int argc,int32_t *dayno,int32_t *daytime)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t d_00;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int in_EDI;
  double __x;
  double dVar3;
  double dd;
  double dt;
  int ms;
  int ss;
  int mm;
  int hh;
  caldate_t cd;
  int32_t d;
  int32_t m;
  int32_t y;
  vm_val_t *in_stack_ffffffffffffffb0;
  int32_t *in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc4;
  caldate_t *in_stack_ffffffffffffffd0;
  
  CVmStack::get((long)in_EDI);
  iVar1 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
  CVmStack::get((long)(in_EDI + 1));
  iVar2 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
  CVmStack::get((long)(in_EDI + 2));
  d_00 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
  caldate_t::caldate_t((caldate_t *)&stack0xffffffffffffffd0,iVar1,iVar2,d_00);
  iVar1 = caldate_t::dayno(in_stack_ffffffffffffffd0);
  *in_RDX = iVar1;
  *in_RCX = 0;
  if (in_ESI == 7) {
    CVmStack::get((long)(in_EDI + 3));
    iVar1 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
    CVmStack::get((long)(in_EDI + 4));
    iVar2 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
    CVmStack::get((long)(in_EDI + 5));
    in_stack_ffffffffffffffc4 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
    CVmStack::get((long)(in_EDI + 6));
    in_stack_ffffffffffffffc0 = vm_val_t::num_to_int(in_stack_ffffffffffffffb0);
    __x = (double)in_stack_ffffffffffffffc4 * 1000.0 +
          (double)iVar1 * 60.0 * 60.0 * 1000.0 + (double)iVar2 * 60.0 * 1000.0 +
          (double)in_stack_ffffffffffffffc0;
    dVar3 = floor(__x / 86400000.0);
    in_stack_ffffffffffffffb8 = (int32_t *)fmod(__x,86400000.0);
    dVar3 = (double)*in_RDX + dVar3;
    if ((dVar3 < -2147483648.0) || (2147483647.0 < dVar3)) {
      err_throw(0);
    }
    *in_RDX = (int)dVar3;
    *in_RCX = (int)(double)in_stack_ffffffffffffffb8;
  }
  caldate_t::normalize
            ((int32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void parse_ymd_args(VMG_ int argofs, int argc,
                           int32_t &dayno, int32_t &daytime)
{
    /* get the year, month, and day */
    int32_t y = G_stk->get(argofs + 0)->num_to_int(vmg0_);
    int32_t m = G_stk->get(argofs + 1)->num_to_int(vmg0_);
    int32_t d = G_stk->get(argofs + 2)->num_to_int(vmg0_);

    /* figure the day number for the given calendar date */
    caldate_t cd(y, m, d);
    dayno = cd.dayno();
    
    /* 
     *   if this is the 7-argument version, get the time; otherwise it's
     *   implicitly midnight on the given date
     */
    daytime = 0;
    if (argc == 7)
    {
        /* get the hour and minute as integers, and seconds */
        int hh = G_stk->get(argofs + 3)->num_to_int(vmg0_);
        int mm = G_stk->get(argofs + 4)->num_to_int(vmg0_);
        int ss = G_stk->get(argofs + 5)->num_to_int(vmg0_);
        int ms = G_stk->get(argofs + 6)->num_to_int(vmg0_);
        
        /* 
         *   Combine the time components into 'daytime' in milliseconds.
         *   This could be a very large number, so work in double until we
         *   can normalize it.  Note that we're working in whole numbers only
         *   (no fractions), so a double will be exact - all we're worried
         *   about here is the extra integer precision it can hold, not the
         *   fractional part.
         */
        double dt = hh*60.*60.*1000. + mm*60.*1000. + ss*1000. + ms;

        /* figure the overflow into the day number (and make sure it fits) */
        double dd = floor(dt / (24.*60.*60.*1000.));
        dt = fmod(dt, 24.*60.*60.*1000.);

        /* apply the overflow to the day number, and make sure it fits */
        dd += dayno;
        if (dd < INT32MINVAL || dd > INT32MAXVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* it's all normalized and in range, so convert back to int32 */
        dayno = (int32_t)dd;
        daytime = (int32_t)dt;
    }

    /* normalize the result */
    caldate_t::normalize(dayno, daytime);
}